

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O0

void handle_inform_queue(list<InformItem_*,_std::allocator<InformItem_*>_> *informList)

{
  bool bVar1;
  reference ppIVar2;
  anon_class_1_0_00000001 local_59;
  function<bool_(InformItem_*)> local_58;
  InformItem *local_38;
  InformItem *informItem;
  iterator __end1;
  iterator __begin1;
  list<InformItem_*,_std::allocator<InformItem_*>_> *__range1;
  unsigned_long thisLoop;
  list<InformItem_*,_std::allocator<InformItem_*>_> *informList_local;
  
  __end1 = std::__cxx11::list<InformItem_*,_std::allocator<InformItem_*>_>::begin(informList);
  informItem = (InformItem *)
               std::__cxx11::list<InformItem_*,_std::allocator<InformItem_*>_>::end(informList);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&informItem), bVar1) {
    ppIVar2 = std::_List_iterator<InformItem_*>::operator*(&__end1);
    local_38 = *ppIVar2;
    if (((((local_38->received & 1U) == 0) && (local_38->delay_ms < -local_38->lastSent)) &&
        (local_38->missed = true, local_38->retries != 0)) && (local_38->trap != (SNMPTrap *)0x0)) {
      SNMPTrap::sendTo(local_38->trap,&local_38->ip,true);
      local_38->lastSent = 0;
      local_38->missed = false;
      local_38->retries = local_38->retries + -1;
    }
    std::_List_iterator<InformItem_*>::operator++(&__end1);
  }
  std::function<bool(InformItem*)>::
  function<handle_inform_queue(std::__cxx11::list<InformItem*,std::allocator<InformItem*>>&)::__0,void>
            ((function<bool(InformItem*)> *)&local_58,&local_59);
  remove_inform_from_list(informList,&local_58);
  std::function<bool_(InformItem_*)>::~function(&local_58);
  return;
}

Assistant:

void handle_inform_queue(std::list<struct InformItem *> &informList) {
    auto thisLoop = millis();
    for(auto informItem : informList){
        if(!informItem->received && thisLoop - informItem->lastSent > informItem->delay_ms){
            SNMP_LOGD("Missed Inform receive\n");
            // check if sending again
            informItem->missed = true;
            if(!informItem->retries){
                SNMP_LOGD("No more retries for inform: %lu, removing\n", informItem->requestID);
                continue;
            }
            if(informItem->trap){
                SNMP_LOGD("No response received in %lums, Resending Inform: %lu\n", thisLoop - informItem->lastSent, informItem->requestID);
                informItem->trap->sendTo(informItem->ip, true);
                informItem->lastSent = thisLoop;
                informItem->missed = false;
                informItem->retries--;
            }
        }
    }
    remove_inform_from_list(informList, [](struct InformItem* informItem) -> bool {
        return informItem->received || (informItem->retries == 0 && informItem->missed);
    });
}